

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3GetDeltaVarint3(char **pp,char *pEnd,int bDescIdx,sqlite3_int64 *pVal)

{
  int iVar1;
  long in_RAX;
  long lVar2;
  sqlite3_int64 iVal;
  long local_28;
  
  if (*pp < pEnd) {
    local_28 = in_RAX;
    iVar1 = sqlite3Fts3GetVarint(*pp,&local_28);
    *pp = *pp + iVar1;
    lVar2 = -local_28;
    if (bDescIdx == 0) {
      lVar2 = local_28;
    }
    *pVal = *pVal + lVar2;
  }
  else {
    *pp = (char *)0x0;
  }
  return;
}

Assistant:

static void fts3GetDeltaVarint3(
  char **pp,                      /* IN/OUT: Point to read varint from */
  char *pEnd,                     /* End of buffer */
  int bDescIdx,                   /* True if docids are descending */
  sqlite3_int64 *pVal             /* IN/OUT: Integer value */
){
  if( *pp>=pEnd ){
    *pp = 0;
  }else{
    sqlite3_int64 iVal;
    *pp += sqlite3Fts3GetVarint(*pp, &iVal);
    if( bDescIdx ){
      *pVal -= iVal;
    }else{
      *pVal += iVal;
    }
  }
}